

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O3

void __thiscall
RegVmLoweredBlock::AddInstruction
          (RegVmLoweredBlock *this,ExpressionContext *ctx,SynBase *location,
          RegVmInstructionCode code,uchar rA,uchar rB,uchar rC,uint argument)

{
  Allocator *allocator;
  int iVar1;
  undefined4 extraout_var;
  VmConstant *pVVar2;
  ExpressionContext *ctx_00;
  RegVmLoweredInstruction *instruction;
  
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])();
  instruction = (RegVmLoweredInstruction *)CONCAT44(extraout_var,iVar1);
  allocator = ctx->allocator;
  ctx_00 = (ExpressionContext *)0x0;
  pVVar2 = CreateConstantInt(allocator,(SynBase *)0x0,argument);
  instruction->location = location;
  instruction->code = code;
  instruction->rA = rA;
  instruction->rB = rB;
  instruction->rC = rC;
  instruction->argument = pVVar2;
  (instruction->preKillRegisters).allocator = allocator;
  (instruction->preKillRegisters).data = (instruction->preKillRegisters).little;
  (instruction->preKillRegisters).count = 0;
  (instruction->preKillRegisters).max = 8;
  (instruction->postKillRegisters).allocator = allocator;
  (instruction->postKillRegisters).data = (instruction->postKillRegisters).little;
  (instruction->postKillRegisters).count = 0;
  (instruction->postKillRegisters).max = 8;
  instruction->parent = (RegVmLoweredBlock *)0x0;
  instruction->prevSibling = (RegVmLoweredInstruction *)0x0;
  instruction->nextSibling = (RegVmLoweredInstruction *)0x0;
  AddInstruction(this,ctx_00,instruction);
  return;
}

Assistant:

void RegVmLoweredBlock::AddInstruction(ExpressionContext &ctx, SynBase *location, RegVmInstructionCode code, unsigned char rA, unsigned char rB, unsigned char rC, unsigned argument)
{
	AddInstruction(ctx, new (ctx.get<RegVmLoweredInstruction>()) RegVmLoweredInstruction(ctx.allocator, location, code, rA, rB, rC, CreateConstantInt(ctx.allocator, NULL, argument)));
}